

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

int __thiscall
ImFontAtlas::AddCustomRectFontGlyph
          (ImFontAtlas *this,ImFont *font,ImWchar id,int width,int height,float advance_x,
          ImVec2 *offset)

{
  float fVar1;
  float fVar2;
  int iVar3;
  ImFontAtlasCustomRect *pIVar4;
  ImFontAtlasCustomRect *__dest;
  int iVar5;
  int iVar6;
  
  if (font == (ImFont *)0x0) {
    __assert_fail("font != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui_draw.cpp"
                  ,0x6c7,
                  "int ImFontAtlas::AddCustomRectFontGlyph(ImFont *, ImWchar, int, int, float, const ImVec2 &)"
                 );
  }
  if (width - 1U < 0xffff) {
    if (height - 1U < 0xffff) {
      fVar1 = offset->x;
      fVar2 = offset->y;
      iVar6 = (this->CustomRects).Size;
      iVar3 = (this->CustomRects).Capacity;
      if (iVar6 == iVar3) {
        iVar6 = iVar6 + 1;
        if (iVar3 == 0) {
          iVar5 = 8;
        }
        else {
          iVar5 = iVar3 / 2 + iVar3;
        }
        if (iVar6 < iVar5) {
          iVar6 = iVar5;
        }
        if (iVar3 < iVar6) {
          __dest = (ImFontAtlasCustomRect *)ImGui::MemAlloc((long)iVar6 << 5);
          pIVar4 = (this->CustomRects).Data;
          if (pIVar4 != (ImFontAtlasCustomRect *)0x0) {
            memcpy(__dest,pIVar4,(long)(this->CustomRects).Size << 5);
            ImGui::MemFree((this->CustomRects).Data);
          }
          (this->CustomRects).Data = __dest;
          (this->CustomRects).Capacity = iVar6;
        }
      }
      pIVar4 = (this->CustomRects).Data;
      iVar6 = (this->CustomRects).Size;
      pIVar4[iVar6].ID = (uint)id;
      pIVar4[iVar6].Width = (unsigned_short)width;
      pIVar4[iVar6].Height = (unsigned_short)height;
      pIVar4[iVar6].X = 0xffff;
      pIVar4[iVar6].Y = 0xffff;
      pIVar4[iVar6].GlyphAdvanceX = advance_x;
      pIVar4[iVar6].GlyphOffset.x = fVar1;
      pIVar4[iVar6].GlyphOffset.y = fVar2;
      pIVar4[iVar6].Font = font;
      iVar6 = (this->CustomRects).Size;
      (this->CustomRects).Size = iVar6 + 1;
      return iVar6;
    }
    __assert_fail("height > 0 && height <= 0xFFFF",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui_draw.cpp"
                  ,0x6c9,
                  "int ImFontAtlas::AddCustomRectFontGlyph(ImFont *, ImWchar, int, int, float, const ImVec2 &)"
                 );
  }
  __assert_fail("width > 0 && width <= 0xFFFF",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui_draw.cpp"
                ,0x6c8,
                "int ImFontAtlas::AddCustomRectFontGlyph(ImFont *, ImWchar, int, int, float, const ImVec2 &)"
               );
}

Assistant:

int ImFontAtlas::AddCustomRectFontGlyph(ImFont* font, ImWchar id, int width, int height, float advance_x, const ImVec2& offset)
{
    IM_ASSERT(font != NULL);
    IM_ASSERT(width > 0 && width <= 0xFFFF);
    IM_ASSERT(height > 0 && height <= 0xFFFF);
    ImFontAtlasCustomRect r;
    r.ID = id;
    r.Width = (unsigned short)width;
    r.Height = (unsigned short)height;
    r.GlyphAdvanceX = advance_x;
    r.GlyphOffset = offset;
    r.Font = font;
    CustomRects.push_back(r);
    return CustomRects.Size - 1; // Return index
}